

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O2

RsRuleSyntax * __thiscall slang::parsing::Parser::parseRsRule(Parser *this)

{
  bool bVar1;
  int iVar2;
  ExpressionSyntax *pEVar3;
  ParenthesizedExpressionSyntax *expr;
  RandJoinClauseSyntax *randJoin;
  RsProdSyntax *pRVar4;
  RsCodeBlockSyntax *codeBlock;
  RsWeightClauseSyntax *weightClause;
  undefined4 extraout_var;
  RsRuleSyntax *pRVar5;
  SourceLocation SVar6;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  Token TVar7;
  Token join;
  Token openParen;
  Token closeParen;
  SourceRange SVar8;
  SourceRange SVar9;
  SmallVector<slang::syntax::RsProdSyntax_*,_5UL> prods;
  RsProdSyntax *prod;
  undefined4 local_60;
  undefined4 uStack_5c;
  SyntaxNode *local_58;
  SyntaxNode *pSStack_50;
  pointer local_40;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,RandKeyword);
  if (bVar1) {
    TVar7 = ParserBase::consume(&this->super_ParserBase);
    join = ParserBase::expect(&this->super_ParserBase,JoinKeyword);
    bVar1 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
    if (bVar1) {
      openParen = ParserBase::consume(&this->super_ParserBase);
      pEVar3 = parseExpression(this);
      closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      expr = slang::syntax::SyntaxFactory::parenthesizedExpression
                       (&this->factory,openParen,pEVar3,closeParen);
    }
    else {
      expr = (ParenthesizedExpressionSyntax *)0x0;
    }
    randJoin = slang::syntax::SyntaxFactory::randJoinClause(&this->factory,TVar7,join,expr);
  }
  else {
    randJoin = (RandJoinClauseSyntax *)0x0;
  }
  prods.super_SmallVectorBase<slang::syntax::RsProdSyntax_*>.data_ =
       (pointer)prods.super_SmallVectorBase<slang::syntax::RsProdSyntax_*>.firstElement;
  prods.super_SmallVectorBase<slang::syntax::RsProdSyntax_*>.len = 0;
  prods.super_SmallVectorBase<slang::syntax::RsProdSyntax_*>.cap = 5;
  while( true ) {
    pRVar4 = parseRsProd(this);
    prod = pRVar4;
    if (pRVar4 == (RsProdSyntax *)0x0) break;
    SmallVectorBase<slang::syntax::RsProdSyntax*>::emplace_back<slang::syntax::RsProdSyntax*const&>
              ((SmallVectorBase<slang::syntax::RsProdSyntax*> *)&prods,&prod);
    if ((randJoin != (RandJoinClauseSyntax *)0x0) && ((prod->super_SyntaxNode).kind != RsProdItem))
    {
      SVar8 = slang::syntax::SyntaxNode::sourceRange(&prod->super_SyntaxNode);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x9d0005,SVar8);
    }
  }
  if ((randJoin != (RandJoinClauseSyntax *)0x0) &&
     (prods.super_SmallVectorBase<slang::syntax::RsProdSyntax_*>.len < 2)) {
    SVar8 = slang::syntax::SyntaxNode::sourceRange(&randJoin->super_SyntaxNode);
    SVar6 = SVar8.endLoc;
    if (prods.super_SmallVectorBase<slang::syntax::RsProdSyntax_*>.len != 0) {
      _prod = slang::syntax::SyntaxNode::getLastToken
                        (&prods.super_SmallVectorBase<slang::syntax::RsProdSyntax_*>.data_
                          [prods.super_SmallVectorBase<slang::syntax::RsProdSyntax_*>.len - 1]->
                          super_SyntaxNode);
      SVar9 = Token::range((Token *)&prod);
      SVar6 = SVar9.endLoc;
    }
    SVar9.endLoc = SVar6;
    SVar9.startLoc = SVar8.startLoc;
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x9c0005,SVar9);
  }
  bVar1 = ParserBase::peek(&this->super_ParserBase,ColonEquals);
  if (bVar1) {
    TVar7 = ParserBase::consume(&this->super_ParserBase);
    pEVar3 = parsePrimaryExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x20);
    bVar1 = ParserBase::peek(&this->super_ParserBase,OpenBrace);
    if (bVar1) {
      codeBlock = parseRsCodeBlock(this);
    }
    else {
      codeBlock = (RsCodeBlockSyntax *)0x0;
    }
    weightClause = slang::syntax::SyntaxFactory::rsWeightClause
                             (&this->factory,TVar7,pEVar3,&codeBlock->super_RsProdSyntax);
    src = extraout_RDX_00;
  }
  else {
    weightClause = (RsWeightClauseSyntax *)0x0;
    src = extraout_RDX;
  }
  iVar2 = SmallVectorBase<slang::syntax::RsProdSyntax_*>::copy
                    (&prods.super_SmallVectorBase<slang::syntax::RsProdSyntax_*>,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  local_40 = (pointer)CONCAT44(extraout_var,iVar2);
  local_60 = 1;
  local_58 = (SyntaxNode *)0x0;
  pSStack_50 = (SyntaxNode *)0x0;
  prod = (RsProdSyntax *)&PTR_getChild_005a4060;
  pRVar5 = slang::syntax::SyntaxFactory::rsRule
                     (&this->factory,randJoin,(SyntaxList<slang::syntax::RsProdSyntax> *)&prod,
                      weightClause);
  SmallVectorBase<slang::syntax::RsProdSyntax_*>::cleanup
            (&prods.super_SmallVectorBase<slang::syntax::RsProdSyntax_*>,(EVP_PKEY_CTX *)randJoin);
  return pRVar5;
}

Assistant:

RsRuleSyntax& Parser::parseRsRule() {
    RandJoinClauseSyntax* randJoin = nullptr;
    if (peek(TokenKind::RandKeyword)) {
        auto rand = consume();
        auto join = expect(TokenKind::JoinKeyword);

        ParenthesizedExpressionSyntax* parenExpr = nullptr;
        if (peek(TokenKind::OpenParenthesis)) {
            auto openParen = consume();
            auto& expr = parseExpression();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            parenExpr = &factory.parenthesizedExpression(openParen, expr, closeParen);
        }

        randJoin = &factory.randJoinClause(rand, join, parenExpr);
    }

    SmallVector<RsProdSyntax*> prods;
    while (true) {
        auto prod = parseRsProd();
        if (!prod)
            break;

        prods.push_back(prod);
        if (randJoin && prod->kind != SyntaxKind::RsProdItem)
            addDiag(diag::RandJoinProdItem, prod->sourceRange());
    }

    if (randJoin && prods.size() < 2) {
        SourceRange range = randJoin->sourceRange();
        if (!prods.empty())
            range = SourceRange{range.start(), prods.back()->getLastToken().range().end()};

        addDiag(diag::RandJoinNotEnough, range);
    }

    RsWeightClauseSyntax* weightClause = nullptr;
    if (peek(TokenKind::ColonEquals)) {
        auto colonEqual = consume();
        auto& weight = parsePrimaryExpression(ExpressionOptions::DisallowVectors);

        RsCodeBlockSyntax* codeBlock = nullptr;
        if (peek(TokenKind::OpenBrace))
            codeBlock = &parseRsCodeBlock();

        weightClause = &factory.rsWeightClause(colonEqual, weight, codeBlock);
    }

    return factory.rsRule(randJoin, prods.copy(alloc), weightClause);
}